

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O1

void duckdb_je_hpa_shard_stats_merge(tsdn_t *tsdn,hpa_shard_t *shard,hpa_shard_stats_t *dst)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  pthread_mutex_t *__mutex_00;
  uint64_t uVar3;
  int iVar4;
  
  __mutex = (pthread_mutex_t *)((long)&(shard->grow_mtx).field_0 + 0x48);
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&shard->grow_mtx);
    (shard->grow_mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(shard->grow_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((shard->grow_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (shard->grow_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(shard->grow_mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  __mutex_00 = (pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48);
  iVar4 = pthread_mutex_trylock(__mutex_00);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&shard->mtx);
    (shard->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(shard->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((shard->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (shard->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(shard->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  duckdb_je_psset_stats_accum(&dst->psset_stats,&(shard->psset).stats);
  uVar3 = (shard->stats).npurges;
  (dst->nonderived_stats).npurge_passes =
       (dst->nonderived_stats).npurge_passes + (shard->stats).npurge_passes;
  (dst->nonderived_stats).npurges = (dst->nonderived_stats).npurges + uVar3;
  uVar3 = (shard->stats).ndehugifies;
  (dst->nonderived_stats).nhugifies = (shard->stats).nhugifies + (dst->nonderived_stats).nhugifies;
  (dst->nonderived_stats).ndehugifies = uVar3 + (dst->nonderived_stats).ndehugifies;
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex_00);
  (shard->grow_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
hpa_shard_stats_merge(tsdn_t *tsdn, hpa_shard_t *shard,
    hpa_shard_stats_t *dst) {
	hpa_do_consistency_checks(shard);

	malloc_mutex_lock(tsdn, &shard->grow_mtx);
	malloc_mutex_lock(tsdn, &shard->mtx);
	psset_stats_accum(&dst->psset_stats, &shard->psset.stats);
	hpa_shard_nonderived_stats_accum(&dst->nonderived_stats, &shard->stats);
	malloc_mutex_unlock(tsdn, &shard->mtx);
	malloc_mutex_unlock(tsdn, &shard->grow_mtx);
}